

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_dense.cpp
# Opt level: O2

void __thiscall
test_matrix_dense_size_row_column_size_resize_Test::
test_matrix_dense_size_row_column_size_resize_Test
          (test_matrix_dense_size_row_column_size_resize_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00171e70;
  return;
}

Assistant:

TEST(test_matrix_dense, size_row_column_size_resize) {
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix;
  Matrix_Dense<Scalar, 2, 2> static_matrix;

  EXPECT_EQ(dynamic_matrix.size().first, 0);
  EXPECT_EQ(dynamic_matrix.size().second, 0);
  EXPECT_EQ(static_matrix.size().first, 2);
  EXPECT_EQ(static_matrix.size().second, 2);

  EXPECT_EQ(dynamic_matrix.size_row(), 0);
  EXPECT_EQ(dynamic_matrix.size_column(), 0);
  EXPECT_EQ(static_matrix.size_row(), 2);
  EXPECT_EQ(static_matrix.size_column(), 2);

  dynamic_matrix.resize(1);
  EXPECT_EQ(dynamic_matrix.size().first, 1);
  EXPECT_EQ(dynamic_matrix.size().second, 0);
  EXPECT_EQ(dynamic_matrix.size_row(), 1);
  EXPECT_EQ(dynamic_matrix.size_column(), 0);
  FOR_EACH(row, dynamic_matrix) EXPECT_EQ(row.size(), 0);

  dynamic_matrix.resize(3, 2);
  EXPECT_EQ(dynamic_matrix.size().first, 3);
  EXPECT_EQ(dynamic_matrix.size().second, 2);
  EXPECT_EQ(dynamic_matrix.size_row(), 3);
  EXPECT_EQ(dynamic_matrix.size_column(), 2);
  FOR_EACH(row, dynamic_matrix) EXPECT_EQ(row.size(), 2);
}